

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_wrapper.h
# Opt level: O0

double L18_4::use_f<double,L18_4::Fp>(double v,Fp f)

{
  ostream *poVar1;
  void *this;
  double dVar2;
  double v_local;
  Fp f_local;
  
  use_f<double,_L18_4::Fp>::count = use_f<double,_L18_4::Fp>::count + 1;
  v_local = f._z;
  poVar1 = std::operator<<((ostream *)&std::cout," use_f count = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,use_f<double,_L18_4::Fp>::count);
  poVar1 = std::operator<<(poVar1,", &count = ");
  this = (void *)std::ostream::operator<<(poVar1,&use_f<double,_L18_4::Fp>::count);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  dVar2 = Fp::operator()((Fp *)&v_local,v);
  return dVar2;
}

Assistant:

T use_f(T v, F f) {
        static int count = 0;
        count ++;
        std::cout << " use_f count = " << count << ", &count = " << &count << std::endl;
        return f(v);
    }